

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void webrtc::FilterAdaptation
               (int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
               float (*e_fft) [65],float (*h_fft_buf) [2080])

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  int iVar9;
  float fft [128];
  float afStack_4338 [4150];
  undefined8 uStack_260;
  int local_24c;
  ulong local_248;
  long local_240;
  float local_238 [64];
  undefined1 local_138 [264];
  
  if (0 < num_partitions) {
    local_24c = num_partitions * -0x41;
    local_240 = (long)x_fft_buf_block_pos;
    local_248 = (ulong)(uint)num_partitions;
    iVar9 = x_fft_buf_block_pos * 0x41;
    pfVar7 = h_fft_buf[1] + 1;
    uVar8 = 0;
    do {
      iVar5 = local_24c;
      if ((long)(uVar8 + local_240) < (long)local_248) {
        iVar5 = 0;
      }
      lVar6 = 0x820;
      do {
        fVar1 = x_fft_buf[-1][(iVar5 + iVar9) + lVar6];
        fVar2 = (*x_fft_buf)[(iVar5 + iVar9) + lVar6];
        fVar3 = e_fft[-0x20][lVar6];
        fVar4 = e_fft[-0x1f][lVar6];
        afStack_4338[lVar6 * 2] = fVar1 * fVar3 + fVar2 * fVar4;
        afStack_4338[lVar6 * 2 + 1] = fVar1 * fVar4 - fVar3 * fVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x860);
      lVar6 = (long)((int)(uVar8 + local_240) * 0x41 + iVar5);
      local_238[1] = (*x_fft_buf)[lVar6 + 0x40] * (*e_fft)[0x40] +
                     x_fft_buf[1][lVar6 + 0x40] * e_fft[1][0x40];
      uStack_260 = 0x162619;
      aec_rdft_inverse_128(local_238);
      uStack_260 = 0x16262d;
      memset(local_138,0,0x100);
      lVar6 = 0;
      do {
        local_238[lVar6] = local_238[lVar6] * 0.015625;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      uStack_260 = 0x16265a;
      aec_rdft_forward_128(local_238);
      (*h_fft_buf)[uVar8 * 0x41] = local_238[0] + (*h_fft_buf)[uVar8 * 0x41];
      (*h_fft_buf)[uVar8 * 0x41 + 0x40] = local_238[1] + (*h_fft_buf)[uVar8 * 0x41 + 0x40];
      lVar6 = 0;
      do {
        pfVar7[lVar6 + -0x820] = local_238[lVar6 * 2 + 2] + pfVar7[lVar6 + -0x820];
        pfVar7[lVar6] = local_238[lVar6 * 2 + 3] + pfVar7[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x3f);
      uVar8 = uVar8 + 1;
      iVar9 = iVar9 + 0x41;
      pfVar7 = pfVar7 + 0x41;
    } while (uVar8 != local_248);
  }
  return;
}

Assistant:

static void FilterAdaptation(
    int num_partitions,
    int x_fft_buf_block_pos,
    float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
    float e_fft[2][PART_LEN1],
    float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1]) {
  int i, j;
  float fft[PART_LEN2];
  for (i = 0; i < num_partitions; i++) {
    int xPos = (i + x_fft_buf_block_pos) * (PART_LEN1);
    int pos;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * PART_LEN1;
    }

    pos = i * PART_LEN1;

    for (j = 0; j < PART_LEN; j++) {
      fft[2 * j] = MulRe(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                         e_fft[0][j], e_fft[1][j]);
      fft[2 * j + 1] = MulIm(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                             e_fft[0][j], e_fft[1][j]);
    }
    fft[1] =
        MulRe(x_fft_buf[0][xPos + PART_LEN], -x_fft_buf[1][xPos + PART_LEN],
              e_fft[0][PART_LEN], e_fft[1][PART_LEN]);

    aec_rdft_inverse_128(fft);
    memset(fft + PART_LEN, 0, sizeof(float) * PART_LEN);

    // fft scaling
    {
      float scale = 2.0f / PART_LEN2;
      for (j = 0; j < PART_LEN; j++) {
        fft[j] *= scale;
      }
    }
    aec_rdft_forward_128(fft);

    h_fft_buf[0][pos] += fft[0];
    h_fft_buf[0][pos + PART_LEN] += fft[1];

    for (j = 1; j < PART_LEN; j++) {
      h_fft_buf[0][pos + j] += fft[2 * j];
      h_fft_buf[1][pos + j] += fft[2 * j + 1];
    }
  }
}